

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadQuadMesh(XMLLoader *this,Ref<embree::XML> *xml)

{
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *pvVar1;
  string *psVar2;
  QuadMeshNode *pQVar3;
  _Alloc_hider _Var4;
  ulong siglen;
  undefined8 *in_RDX;
  uchar *extraout_RDX;
  uchar *sig;
  uchar *extraout_RDX_00;
  size_t i;
  long lVar5;
  ulong uVar6;
  uchar *in_R8;
  size_t in_R9;
  size_t i_1;
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  *this_00;
  Ref<embree::XML> animation;
  vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> indices;
  Ref<embree::SceneGraph::MaterialNode> material;
  Ref<embree::XML> local_b0;
  atomic<unsigned_long> local_a8;
  element_type *peStack_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_98;
  Vec3fa *local_90;
  QuadMeshNode *local_88;
  allocator local_79;
  undefined8 *local_78;
  undefined1 local_70 [8];
  undefined1 local_68 [48];
  _Alloc_hider local_38;
  
  psVar2 = (string *)*in_RDX;
  local_78 = in_RDX;
  std::__cxx11::string::string((string *)&local_a8,"material",(allocator *)&local_b0);
  XML::child((XML *)local_68,psVar2);
  loadMaterial((XMLLoader *)(local_68 + 0x28),xml);
  if ((_func_int **)local_68._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_68._0_8_ + 0x18))();
  }
  std::__cxx11::string::~string((string *)&local_a8);
  local_88 = (QuadMeshNode *)::operator_new(0xd8);
  local_68._32_8_ = local_68._40_8_;
  local_38._M_p = (pointer)this;
  if ((_Base_ptr)local_68._40_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_68._40_8_ + 0x10))();
  }
  pQVar3 = local_88;
  SceneGraph::QuadMeshNode::QuadMeshNode
            (local_88,(Ref<embree::SceneGraph::MaterialNode> *)(local_68 + 0x20),
             (BBox1f)0x3f80000000000000,0);
  (*(pQVar3->super_Node).super_RefCount._vptr_RefCount[2])(pQVar3);
  if ((_Base_ptr)local_68._32_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)(_Rb_tree_color *)local_68._32_8_ + 0x18))();
  }
  psVar2 = (string *)*local_78;
  std::__cxx11::string::string((string *)&local_a8,"animated_positions",(allocator *)local_68);
  XML::childOpt((XML *)&local_b0,psVar2);
  std::__cxx11::string::~string((string *)&local_a8);
  pvVar1 = &local_88->positions;
  if (local_b0.ptr == (XML *)0x0) {
    psVar2 = (string *)*local_78;
    std::__cxx11::string::string((string *)local_68,"positions",&local_79);
    XML::childOpt((XML *)local_70,psVar2);
    loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,(Ref<embree::XML> *)local_70);
    std::
    vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
              ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                *)pvVar1,
               (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
               &local_a8);
    alignedFree(local_90);
    local_90 = (Vec3fa *)0x0;
    peStack_a0 = (element_type *)0x0;
    _Stack_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (local_70 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_70 + 0x18))();
    }
    std::__cxx11::string::~string((string *)local_68);
    if (local_b0.ptr != (XML *)0x0) goto LAB_001754c9;
  }
  else {
    for (uVar6 = 0;
        uVar6 < (ulong)((long)((local_b0.ptr)->children).
                              super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)((local_b0.ptr)->children).
                              super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
      XML::child((XML *)local_68,(size_t)local_b0.ptr);
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,(Ref<embree::XML> *)local_68);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)pvVar1,(avector<Vec3fa> *)&local_a8);
      alignedFree(local_90);
      local_90 = (Vec3fa *)0x0;
      peStack_a0 = (element_type *)0x0;
      _Stack_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((_func_int **)local_68._0_8_ != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_68._0_8_ + 0x18))();
      }
    }
LAB_001754c9:
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])(local_b0.ptr);
  }
  psVar2 = (string *)*local_78;
  std::__cxx11::string::string((string *)&local_a8,"animated_normals",(allocator *)&local_b0);
  XML::childOpt((XML *)local_68,psVar2);
  std::__cxx11::string::~string((string *)&local_a8);
  if ((_func_int **)local_68._0_8_ == (_func_int **)0x0) {
    psVar2 = (string *)*local_78;
    std::__cxx11::string::string((string *)&local_a8,"normals",(allocator *)local_70);
    XML::childOpt((XML *)&local_b0,psVar2);
    std::__cxx11::string::~string((string *)&local_a8);
    if (local_b0.ptr != (XML *)0x0) {
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,&local_b0);
      if (peStack_a0 != (element_type *)0x0) {
        pvVar1 = &local_88->normals;
        for (uVar6 = 0;
            uVar6 < (ulong)((long)(local_88->positions).
                                  super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(local_88->positions).
                                  super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5); uVar6 = uVar6 + 1
            ) {
          std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::push_back(pvVar1,(value_type *)&local_a8);
        }
      }
      alignedFree(local_90);
      if (local_b0.ptr != (XML *)0x0) {
        (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
    }
    if ((_func_int **)local_68._0_8_ == (_func_int **)0x0) goto LAB_00175667;
  }
  else {
    pvVar1 = &local_88->normals;
    for (uVar6 = 0;
        uVar6 < (ulong)((long)*(_func_int **)(local_68._0_8_ + 0x88) -
                        (long)*(_func_int **)(local_68._0_8_ + 0x80) >> 3); uVar6 = uVar6 + 1) {
      XML::child((XML *)&local_b0,local_68._0_8_);
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,&local_b0);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)pvVar1,(avector<Vec3fa> *)&local_a8);
      alignedFree(local_90);
      local_90 = (Vec3fa *)0x0;
      peStack_a0 = (element_type *)0x0;
      _Stack_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (local_b0.ptr != (XML *)0x0) {
        (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
    }
  }
  (**(code **)(*(_func_int **)local_68._0_8_ + 0x18))(local_68._0_8_);
LAB_00175667:
  psVar2 = (string *)*local_78;
  std::__cxx11::string::string((string *)&local_a8,"texcoords",(allocator *)local_70);
  XML::childOpt((XML *)&local_b0,psVar2);
  loadVec2fArray((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)local_68,
                 (XMLLoader *)xml,&local_b0);
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::_M_move_assign
            (&local_88->texcoords,
             (_Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)local_68);
  std::_Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::~_Vector_base
            ((_Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)local_68);
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_a8);
  psVar2 = (string *)*local_78;
  std::__cxx11::string::string((string *)&local_a8,"indices",(allocator *)local_70);
  XML::childOpt((XML *)&local_b0,psVar2);
  loadVec4iArray((vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> *)local_68,
                 (XMLLoader *)xml,&local_b0);
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_a8);
  this_00 = &local_88->quads;
  lVar5 = 0;
  uVar6 = 0;
  sig = extraout_RDX;
  while( true ) {
    pQVar3 = local_88;
    siglen = (long)(local_68._8_8_ - local_68._0_8_) >> 4;
    if (siglen <= uVar6) break;
    local_a8.super___atomic_base<unsigned_long>._M_i =
         *(__atomic_base<unsigned_long> *)(local_68._0_8_ + lVar5);
    peStack_a0 = (element_type *)((__int_type *)(local_68._0_8_ + lVar5))[1];
    xml = (Ref<embree::XML> *)&local_a8;
    std::
    vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
    ::emplace_back<embree::SceneGraph::QuadMeshNode::Quad>(this_00,(Quad *)&local_a8);
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x10;
    sig = extraout_RDX_00;
  }
  SceneGraph::QuadMeshNode::verify(local_88,(EVP_PKEY_CTX *)xml,sig,siglen,in_R8,in_R9);
  _Var4._M_p = local_38._M_p;
  *(QuadMeshNode **)local_38._M_p = pQVar3;
  (*(pQVar3->super_Node).super_RefCount._vptr_RefCount[2])(pQVar3);
  std::_Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::~_Vector_base
            ((_Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> *)local_68);
  (*(pQVar3->super_Node).super_RefCount._vptr_RefCount[3])(pQVar3);
  if ((_Base_ptr)local_68._40_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_68._40_8_ + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)_Var4._M_p;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadQuadMesh(const Ref<XML>& xml) 
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::QuadMeshNode> mesh = new SceneGraph::QuadMeshNode(material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->positions.push_back(loadVec3faArray(animation->child(i)));
    } else {
      mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions")));
    }

    if (Ref<XML> animation = xml->childOpt("animated_normals")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->normals.push_back(loadVec3faArray(animation->child(i)));
    }
    else if (Ref<XML> normalbuf = xml->childOpt("normals")) {
      auto vec = loadVec3faArray(normalbuf);
      if (vec.size())
        for (size_t i=0; i<mesh->numTimeSteps(); i++)
          mesh->normals.push_back(vec);
    }
  
    mesh->texcoords = loadVec2fArray(xml->childOpt("texcoords"));

    std::vector<Vec4i> indices = loadVec4iArray(xml->childOpt("indices"));
    for (size_t i=0; i<indices.size(); i++) 
      mesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(indices[i].x,indices[i].y,indices[i].z,indices[i].w));
    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }